

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuscpp2xml.cpp
# Opt level: O3

QString * addFunction(QString *__return_storage_ptr__,FunctionDef *mm,bool isSignal)

{
  long lVar1;
  char *pcVar2;
  int *piVar3;
  qsizetype qVar4;
  Data *pDVar5;
  ArgumentDef *pAVar6;
  byte bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  QMetaTypeInterface *pQVar12;
  long lVar13;
  long lVar14;
  QChar QVar15;
  char *pcVar16;
  QArrayData *pQVar17;
  uint uVar18;
  int iVar19;
  undefined7 in_register_00000011;
  char16_t *pcVar20;
  storage_type *psVar21;
  byte bVar22;
  char *pcVar23;
  ulong uVar24;
  long in_FS_OFFSET;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QAnyStringView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QAnyStringView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QAnyStringView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QAnyStringView QVar37;
  QByteArrayView QVar38;
  QAnyStringView QVar39;
  QLatin1String QVar40;
  QByteArrayView QVar41;
  QAnyStringView QVar42;
  QByteArrayView QVar43;
  QArrayData *local_178;
  int local_170;
  QChar local_168;
  QArrayData *local_160 [3];
  QLatin1String local_148;
  QLatin1String local_130;
  undefined8 local_120;
  QString local_118;
  type local_f8;
  char *local_e0;
  QString local_d8;
  undefined1 local_b8 [16];
  ulong local_a8;
  QArrayDataPointer<ArgumentDef> local_98;
  QMetaType local_80;
  QString local_78;
  QString local_58;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  pcVar23 = "method";
  uVar18 = (uint)CONCAT71(in_register_00000011,isSignal);
  if (uVar18 != 0) {
    pcVar23 = "signal";
  }
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d._0_4_ = 0xaaaaaaaa;
  local_78.d.d._4_4_ = 0xaaaaaaaa;
  local_78.d.ptr._0_4_ = 0xaaaaaaaa;
  local_78.d.ptr._4_4_ = 0xaaaaaaaa;
  pcVar16 = (mm->name).d.ptr;
  if (pcVar16 == (char *)0x0) {
    pcVar16 = (char *)&QByteArray::_empty;
  }
  QString::asprintf((char *)&local_78,"    <%s name=\"%s\">\n",pcVar23,pcVar16);
  QVar25.m_data = (mm->normalizedType).d.ptr;
  QVar25.m_size = (mm->normalizedType).d.size;
  pQVar12 = (QMetaTypeInterface *)QMetaType::fromName(QVar25);
  if (pQVar12 == (QMetaTypeInterface *)0x0) {
LAB_0013bd01:
    if ((mm->normalizedType).d.size != 0) {
      addFunction();
      goto LAB_0013c64a;
    }
  }
  else {
    iVar10 = (pQVar12->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar10 == 0) {
      iVar10 = QMetaType::registerHelper(pQVar12);
    }
    if (iVar10 == 0) goto LAB_0013bd01;
    if (iVar10 != 0x2b) {
      QMetaType::QMetaType(&local_80,iVar10);
      pcVar16 = (char *)QDBusMetaType::typeToSignature(local_80);
      if (pcVar16 == (char *)0x0) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_0013c64a;
      }
      QVar26.m_data = (storage_type *)0x27;
      QVar26.m_size = (qsizetype)&local_98;
      QString::fromLatin1(QVar26);
      psVar21 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar2 = pcVar16 + 1 + (long)psVar21;
        psVar21 = psVar21 + 1;
      } while (*pcVar2 != '\0');
      QVar27.m_data = psVar21;
      QVar27.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar27);
      local_58.d.d = (Data *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
      local_58.d.ptr = (char16_t *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
      local_58.d.size = CONCAT44(local_f8.d.size._4_4_,(undefined4)local_f8.d.size);
      QString::toHtmlEscaped();
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVar28.m_size = (size_t)&local_98;
      QVar28.field_0.m_data = &local_f8;
      QString::arg_impl(QVar28,local_b8._8_4_,local_a8._0_2_);
      QString::append(&local_78);
      piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = QDBusMetaType::signatureToMetaType(pcVar16);
      if (lVar13 == 0) {
        QVar29.m_data = (storage_type *)0x4b;
        QVar29.m_size = (qsizetype)&local_98;
        QString::fromLatin1(QVar29);
        pcVar16 = (mm->normalizedType).d.ptr;
        if (pcVar16 == (char *)0x0) {
          pcVar16 = (char *)&QByteArray::_empty;
        }
        psVar21 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar2 = pcVar16 + 1 + (long)psVar21;
          psVar21 = psVar21 + 1;
        } while (*pcVar2 != '\0');
        QVar30.m_data = psVar21;
        QVar30.m_size = (qsizetype)&local_f8;
        QString::fromLatin1(QVar30);
        local_58.d.d = (Data *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
        local_58.d.ptr = (char16_t *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
        local_58.d.size = CONCAT44(local_f8.d.size._4_4_,(undefined4)local_f8.d.size);
        QString::toHtmlEscaped();
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        QVar31.m_size = (size_t)&local_98;
        QVar31.field_0.m_data = &local_f8;
        QString::arg_impl(QVar31,local_b8._8_4_,local_a8._0_2_);
        QString::append(&local_78);
        piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
          }
        }
        if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
          }
        }
        if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
  }
  local_98.d = (mm->arguments).d.d;
  local_98.ptr = (mm->arguments).d.ptr;
  local_98.size = (mm->arguments).d.size;
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_98.d)->super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((local_98.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._0_8_ = (QArrayData *)0x0;
  local_b8._8_8_ = (QMetaType *)0x0;
  local_a8 = 0;
  local_d8.d.size = 0;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  iVar10 = qDBusParametersForMethod(mm,(QList<QMetaType> *)local_b8,&local_d8);
  if (iVar10 == -1) {
    local_f8.d.d._0_4_ = 2;
    local_f8.d.d._4_4_ = 0;
    local_f8.d.ptr._0_4_ = 0;
    local_f8.d.ptr._4_4_ = 0;
    local_f8.d.size._0_4_ = 0;
    local_f8.d.size._4_4_ = 0;
    local_e0 = "default";
    QMessageLogger::warning();
    QString::toLocal8Bit_helper((QChar *)&local_118,(longlong)local_d8.d.ptr);
    qVar4 = local_130.m_size;
    pcVar20 = local_118.d.ptr;
    if (local_118.d.ptr == (char16_t *)0x0) {
      pcVar20 = (char16_t *)&QByteArray::_empty;
    }
    psVar21 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar23 = psVar21 + (long)pcVar20 + 1;
      psVar21 = psVar21 + 1;
    } while (*pcVar23 != '\0');
    QVar43.m_data = psVar21;
    QVar43.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar43);
    QTextStream::operator<<((QTextStream *)qVar4,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_130.m_size + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_130.m_size,' ');
    }
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,1,0x10);
      }
    }
    QDebug::~QDebug((QDebug *)&local_130);
LAB_0013c5dc:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (isSignal) {
      if (local_a8 == (long)(iVar10 + 1)) {
        local_f8.d.d._0_4_ = 0x154010;
        local_f8.d.d._4_4_ = 0;
        bVar8 = comparesEqual((QMetaType *)(local_b8._8_8_ + (long)iVar10 * 8),
                              (QMetaType *)&local_f8);
        if (!bVar8) goto LAB_0013bdb6;
      }
      goto LAB_0013c5dc;
    }
LAB_0013bdb6:
    bVar22 = mm->isScriptable;
    if (1 < local_a8) {
      lVar13 = (long)iVar10;
      uVar24 = 1;
      do {
        local_f8.d.d._0_4_ = 0x154010;
        local_f8.d.d._4_4_ = 0;
        bVar8 = comparesEqual((QMetaType *)(local_b8._8_8_ + uVar24 * 8),(QMetaType *)&local_f8);
        pAVar6 = local_98.ptr;
        bVar7 = 1;
        if (!bVar8) {
          local_118.d.d = (Data *)0x0;
          local_118.d.ptr = (char16_t *)0x0;
          local_118.d.size = 0;
          lVar1 = uVar24 - 1;
          if (local_98.ptr[uVar24 - 1].name.d.size != 0) {
            QVar32.m_data = (storage_type *)0xa;
            QVar32.m_size = (qsizetype)&local_58;
            QString::fromLatin1(QVar32);
            QVar33.m_data = (storage_type *)pAVar6[lVar1].name.d.size;
            QVar33.m_size = (qsizetype)&local_130;
            QString::fromLatin1(QVar33);
            QVar34.m_size = (size_t)&local_58;
            QVar34.field_0.m_data = &local_f8;
            QString::arg_impl(QVar34,(int)local_130.m_data,(QChar)(char16_t)local_120);
            pDVar5 = local_118.d.d;
            pQVar17 = (QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
            pcVar20 = (char16_t *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
            local_f8.d.d._0_4_ = SUB84(local_118.d.d,0);
            local_f8.d.d._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
            qVar4 = CONCAT44(local_f8.d.size._4_4_,(undefined4)local_f8.d.size);
            local_f8.d.ptr._0_4_ = SUB84(local_118.d.ptr,0);
            local_f8.d.ptr._4_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
            local_f8.d.size._0_4_ = (undefined4)local_118.d.size;
            local_f8.d.size._4_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
            local_118.d.ptr = pcVar20;
            local_118.d.size = qVar4;
            if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                local_118.d.d = (Data *)pQVar17;
                QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                pQVar17 = &(local_118.d.d)->super_QArrayData;
              }
            }
            local_118.d.d = (Data *)pQVar17;
            if ((QArrayData *)local_130.m_size != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_130.m_size,2,0x10);
              }
            }
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          pcVar16 = (char *)QDBusMetaType::typeToSignature
                                      (((QMetaType *)(local_b8._8_8_ + uVar24 * 8))->d_ptr);
          QVar35.m_data = (storage_type *)0x28;
          QVar35.m_size = (qsizetype)&local_58;
          QString::fromLatin1(QVar35);
          if (pcVar16 == (char *)0x0) {
            local_130.m_size = 0;
          }
          else {
            pQVar17 = (QArrayData *)0xffffffffffffffff;
            do {
              local_130.m_size = (long)&(pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              pcVar2 = pcVar16 + 1 + (long)pQVar17;
              pQVar17 = (QArrayData *)local_130.m_size;
            } while (*pcVar2 != '\0');
          }
          bVar8 = uVar24 - lVar13 != 0 && lVar13 <= (long)uVar24 || isSignal;
          local_148.m_size = (ulong)bVar8 + 2;
          local_148.m_data = "in";
          if (bVar8) {
            local_148.m_data = "out";
          }
          local_130.m_data = pcVar16;
          QString::arg<QString&,QLatin1String,QLatin1String>
                    (&local_f8,&local_58,&local_118,&local_130,&local_148);
          QString::append(&local_78);
          piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
            }
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          lVar14 = QDBusMetaType::signatureToMetaType(pcVar16);
          if (lVar14 == 0) {
            if (((QMetaType *)(local_b8._8_8_ + uVar24 * 8))->d_ptr == (QMetaTypeInterface *)0x0) {
              pcVar16 = (char *)0x0;
            }
            else {
              pcVar16 = ((QMetaType *)(local_b8._8_8_ + uVar24 * 8))->d_ptr->name;
            }
            lVar14 = uVar24 - lVar13;
            if (isSignal) {
              lVar14 = lVar1;
            }
            iVar10 = (int)lVar14;
            if ((long)uVar24 <= lVar13) {
              iVar10 = (int)lVar1;
            }
            QVar36.m_data = (storage_type *)0x4b;
            QVar36.m_size = (qsizetype)local_160;
            QString::fromLatin1(QVar36);
            iVar19 = 0x14993c;
            if (bVar8) {
              iVar19 = 0x149938;
            }
            QVar15.ucs = L'\x02';
            if (bVar8) {
              QVar15.ucs = L'\x03';
            }
            QVar37.m_size = (size_t)local_160;
            QVar37.field_0.m_data = &local_148;
            QString::arg_impl(QVar37,iVar19,QVar15);
            QString::arg_impl((longlong)&local_130,(int)&local_148,iVar10,(QChar)0x0);
            if (pcVar16 == (char *)0x0) {
              psVar21 = (storage_type *)0x0;
            }
            else {
              psVar21 = (storage_type *)0xffffffffffffffff;
              do {
                pcVar2 = pcVar16 + 1 + (long)psVar21;
                psVar21 = psVar21 + 1;
              } while (*pcVar2 != '\0');
            }
            QVar38.m_data = psVar21;
            QVar38.m_size = (qsizetype)&local_f8;
            QString::fromLatin1(QVar38);
            local_58.d.d = (Data *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
            local_58.d.ptr = (char16_t *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
            local_58.d.size = CONCAT44(local_f8.d.size._4_4_,(undefined4)local_f8.d.size);
            QString::toHtmlEscaped();
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            QVar39.m_size = (size_t)&local_130;
            QVar39.field_0.m_data = &local_f8;
            QString::arg_impl(QVar39,local_170,local_168);
            QString::append(&local_78);
            piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
              }
            }
            if (local_178 != (QArrayData *)0x0) {
              LOCK();
              (local_178->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_178->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_178->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_178,2,0x10);
              }
            }
            if ((QArrayData *)local_130.m_size != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_130.m_size,2,0x10);
              }
            }
            if ((QArrayData *)local_148.m_size != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_148.m_size)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_148.m_size)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_148.m_size)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_148.m_size,2,0x10);
              }
            }
            if (local_160[0] != (QArrayData *)0x0) {
              LOCK();
              (local_160[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_160[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_160[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_160[0],2,0x10);
              }
            }
          }
          bVar7 = bVar22;
          if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        bVar22 = bVar7;
        uVar24 = uVar24 + 1;
      } while (uVar24 < local_a8);
    }
    uVar11 = (uVar18 & 0xff) * 0x100 + 0x100;
    if ((bVar22 & 1) != 0) {
      uVar11 = (uVar18 & 0xff) * 0x10 + 0x10;
    }
    if ((flags & uVar11) == 0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      pcVar16 = (mm->tag).d.ptr;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = (char *)&QByteArray::_empty;
      }
      cVar9 = qDBusCheckAsyncTag(pcVar16);
      if (cVar9 != '\0') {
        QVar40.m_data = (char *)0x4c;
        QVar40.m_size = (qsizetype)&local_78;
        QString::append(QVar40);
      }
      pDVar5 = (Data *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
      (__return_storage_ptr__->d).d = pDVar5;
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_78.d.ptr._4_4_,local_78.d.ptr._0_4_);
      (__return_storage_ptr__->d).size = local_78.d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar41.m_data = (storage_type *)0xa;
      QVar41.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar41);
      QVar42.m_size = (size_t)&local_58;
      QVar42.field_0.m_data = &local_f8;
      QString::arg_impl(QVar42,(int)pcVar23,(QChar)0x6);
      QString::append(__return_storage_ptr__);
      piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,8,0x10);
    }
  }
  QArrayDataPointer<ArgumentDef>::~QArrayDataPointer(&local_98);
LAB_0013c64a:
  piVar3 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),2,0x10);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QString addFunction(const FunctionDef &mm, bool isSignal = false) {

    QString xml = QString::asprintf("    <%s name=\"%s\">\n",
                                    isSignal ? "signal" : "method", mm.name.constData());

    // check the return type first
    int typeId = QMetaType::fromName(mm.normalizedType).id();
    if (typeId != QMetaType::Void) {
        if (typeId) {
            const char *typeName = QDBusMetaType::typeToSignature(QMetaType(typeId));
            if (typeName) {
                xml += QString::fromLatin1("      <arg type=\"%1\" direction=\"out\"/>\n")
                        .arg(typeNameToXml(typeName));

                    // do we need to describe this argument?
                    if (!QDBusMetaType::signatureToMetaType(typeName).isValid())
                        xml += QString::fromLatin1("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.Out0\" value=\"%1\"/>\n")
                            .arg(typeNameToXml(mm.normalizedType.constData()));
            } else {
                return QString();
            }
        } else if (!mm.normalizedType.isEmpty()) {
            qWarning() << "Unregistered return type:" << mm.normalizedType.constData();
            return QString();
        }
    }
    QList<ArgumentDef> names = mm.arguments;
    QList<QMetaType> types;
    QString errorMsg;
    int inputCount = qDBusParametersForMethod(mm, types, errorMsg);
    if (inputCount == -1) {
        qWarning() << qPrintable(errorMsg);
        return QString();           // invalid form
    }
    if (isSignal && inputCount + 1 != types.size())
        return QString();           // signal with output arguments?
    if (isSignal && types.at(inputCount) == QDBusMetaTypeId::message())
        return QString();           // signal with QDBusMessage argument?

    bool isScriptable = mm.isScriptable;
    for (qsizetype j = 1; j < types.size(); ++j) {
        // input parameter for a slot or output for a signal
        if (types.at(j) == QDBusMetaTypeId::message()) {
            isScriptable = true;
            continue;
        }

        QString name;
        if (!names.at(j - 1).name.isEmpty())
            name = QString::fromLatin1("name=\"%1\" ").arg(QString::fromLatin1(names.at(j - 1).name));

        bool isOutput = isSignal || j > inputCount;

        const char *signature = QDBusMetaType::typeToSignature(QMetaType(types.at(j)));
        xml += QString::fromLatin1("      <arg %1type=\"%2\" direction=\"%3\"/>\n")
                .arg(name,
                     QLatin1StringView(signature),
                     isOutput ? "out"_L1 : "in"_L1);

        // do we need to describe this argument?
        if (!QDBusMetaType::signatureToMetaType(signature).isValid()) {
            const char *typeName = QMetaType(types.at(j)).name();
            xml += QString::fromLatin1("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.%1%2\" value=\"%3\"/>\n")
                    .arg(isOutput ? "Out"_L1 : "In"_L1)
                    .arg(isOutput && !isSignal ? j - inputCount : j - 1)
                    .arg(typeNameToXml(typeName));
        }
    }

    int wantedMask;
    if (isScriptable)
        wantedMask = isSignal ? QDBusConnection::ExportScriptableSignals
                              : QDBusConnection::ExportScriptableSlots;
    else
        wantedMask = isSignal ? QDBusConnection::ExportNonScriptableSignals
                              : QDBusConnection::ExportNonScriptableSlots;
    if ((flags & wantedMask) != wantedMask)
        return QString();

    if (qDBusCheckAsyncTag(mm.tag.constData()))
        // add the no-reply annotation
        xml += "      <annotation name=\"" ANNOTATION_NO_WAIT "\" value=\"true\"/>\n"_L1;

    QString retval = xml;
    retval += QString::fromLatin1("    </%1>\n").arg(isSignal ? "signal"_L1 : "method"_L1);

    return retval;
}